

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O1

void Abc_FrameDeallocate(Abc_Frame_t *p)

{
  Vec_Int_t *pVVar1;
  void *__ptr;
  int *piVar2;
  void **__ptr_00;
  char *__ptr_01;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  Rwt_ManGlobalStop();
  pVVar1 = p->vAbcObjIds;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    free(pVVar1);
  }
  pVVar3 = p->vCexVec;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar3->nSize) {
      lVar4 = 0;
      do {
        if ((void *)0x2 < pVVar3->pArray[lVar4]) {
          free(pVVar3->pArray[lVar4]);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    free(pVVar3);
  }
  pVVar3 = p->vPoEquivs;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar3->nSize) {
      lVar4 = 0;
      do {
        __ptr = pVVar3->pArray[lVar4];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
            *(undefined8 *)((long)__ptr + 8) = 0;
          }
          free(__ptr);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    free(pVVar3);
  }
  pVVar1 = p->vStatuses;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    free(pVVar1);
  }
  if ((Dec_Man_t *)p->pManDec != (Dec_Man_t *)0x0) {
    Dec_ManStop((Dec_Man_t *)p->pManDec);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  pVVar3 = p->vStore;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    free(pVVar3);
  }
  if ((Aig_Man_t *)p->pSave1 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave1);
  }
  if ((Aig_Man_t *)p->pSave2 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave2);
  }
  if ((Aig_Man_t *)p->pSave3 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave3);
  }
  if ((Aig_Man_t *)p->pSave4 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave4);
  }
  if ((If_DsdMan_t *)p->pManDsd != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd,0);
  }
  if ((If_DsdMan_t *)p->pManDsd2 != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd2,0);
  }
  if (p->pNtkBackup != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pNtkBackup);
  }
  if (p->vPlugInComBinPairs != (Vec_Ptr_t *)0x0) {
    pVVar3 = p->vPlugInComBinPairs;
    if (0 < pVVar3->nSize) {
      lVar4 = 0;
      do {
        if (pVVar3->pArray[lVar4] != (void *)0x0) {
          free(pVVar3->pArray[lVar4]);
        }
        lVar4 = lVar4 + 1;
        pVVar3 = p->vPlugInComBinPairs;
      } while (lVar4 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    if (pVVar3 != (Vec_Ptr_t *)0x0) {
      free(pVVar3);
    }
  }
  if (p->vIndFlops != (Vec_Int_t *)0x0) {
    piVar2 = p->vIndFlops->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vIndFlops->pArray = (int *)0x0;
    }
    if (p->vIndFlops != (Vec_Int_t *)0x0) {
      free(p->vIndFlops);
      p->vIndFlops = (Vec_Int_t *)0x0;
    }
  }
  if (p->vLTLProperties_global != (Vec_Ptr_t *)0x0) {
    __ptr_00 = p->vLTLProperties_global->pArray;
    if (__ptr_00 != (void **)0x0) {
      free(__ptr_00);
      p->vLTLProperties_global->pArray = (void **)0x0;
    }
    if (p->vLTLProperties_global != (Vec_Ptr_t *)0x0) {
      free(p->vLTLProperties_global);
      p->vLTLProperties_global = (Vec_Ptr_t *)0x0;
    }
  }
  Abc_FrameDeleteAllNetworks(p);
  if (p->pDrivingCell != (char *)0x0) {
    free(p->pDrivingCell);
    p->pDrivingCell = (char *)0x0;
  }
  if (p->pCex2 != (Abc_Cex_t *)0x0) {
    free(p->pCex2);
    p->pCex2 = (Abc_Cex_t *)0x0;
  }
  if (p->pCex != (Abc_Cex_t *)0x0) {
    free(p->pCex);
    p->pCex = (Abc_Cex_t *)0x0;
  }
  if (p->pAbcWlcInv != (Vec_Int_t *)0x0) {
    piVar2 = p->pAbcWlcInv->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->pAbcWlcInv->pArray = (int *)0x0;
    }
    if (p->pAbcWlcInv != (Vec_Int_t *)0x0) {
      free(p->pAbcWlcInv);
      p->pAbcWlcInv = (Vec_Int_t *)0x0;
    }
  }
  if (p->pAbcWlcCnf != (Vec_Int_t *)0x0) {
    piVar2 = p->pAbcWlcCnf->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->pAbcWlcCnf->pArray = (int *)0x0;
    }
    if (p->pAbcWlcCnf != (Vec_Int_t *)0x0) {
      free(p->pAbcWlcCnf);
      p->pAbcWlcCnf = (Vec_Int_t *)0x0;
    }
  }
  if (p->pAbcWlcStr != (Vec_Str_t *)0x0) {
    __ptr_01 = p->pAbcWlcStr->pArray;
    if (__ptr_01 != (char *)0x0) {
      free(__ptr_01);
      p->pAbcWlcStr->pArray = (char *)0x0;
    }
    if (p->pAbcWlcStr != (Vec_Str_t *)0x0) {
      free(p->pAbcWlcStr);
      p->pAbcWlcStr = (Vec_Str_t *)0x0;
    }
  }
  if (p != (Abc_Frame_t *)0x0) {
    free(p);
  }
  s_GlobalFrame = (Abc_Frame_t *)0x0;
  return;
}

Assistant:

void Abc_FrameDeallocate( Abc_Frame_t * p )
{
    extern void Rwt_ManGlobalStop();
    extern void undefine_cube_size();
//    extern void Ivy_TruthManStop();
//    Abc_HManStop();
//    undefine_cube_size();
    Rwt_ManGlobalStop();
//    Ivy_TruthManStop();
    if ( p->vAbcObjIds)  Vec_IntFree( p->vAbcObjIds );
    if ( p->vCexVec   )  Vec_PtrFreeFree( p->vCexVec );
    if ( p->vPoEquivs )  Vec_VecFree( (Vec_Vec_t *)p->vPoEquivs );
    if ( p->vStatuses )  Vec_IntFree( p->vStatuses );
    if ( p->pManDec   )  Dec_ManStop( (Dec_Man_t *)p->pManDec );
#ifdef ABC_USE_CUDD
    if ( p->dd        )  Extra_StopManager( p->dd );
#endif
    if ( p->vStore    )  Vec_PtrFree( p->vStore );
    if ( p->pSave1    )  Aig_ManStop( (Aig_Man_t *)p->pSave1 );
    if ( p->pSave2    )  Aig_ManStop( (Aig_Man_t *)p->pSave2 );
    if ( p->pSave3    )  Aig_ManStop( (Aig_Man_t *)p->pSave3 );
    if ( p->pSave4    )  Aig_ManStop( (Aig_Man_t *)p->pSave4 );
    if ( p->pManDsd   )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd, 0 );
    if ( p->pManDsd2  )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd2, 0 );
    if ( p->pNtkBackup)  Abc_NtkDelete( p->pNtkBackup );
    if ( p->vPlugInComBinPairs ) 
    {
        char * pTemp;
        int i;
        Vec_PtrForEachEntry( char *, p->vPlugInComBinPairs, pTemp, i )
            ABC_FREE( pTemp );
        Vec_PtrFree( p->vPlugInComBinPairs );
    }
    Vec_IntFreeP( &p->vIndFlops );
    Vec_PtrFreeP( &p->vLTLProperties_global );
    Abc_FrameDeleteAllNetworks( p );
    ABC_FREE( p->pDrivingCell );
    ABC_FREE( p->pCex2 );
    ABC_FREE( p->pCex );
    Vec_IntFreeP( &p->pAbcWlcInv );
    Vec_IntFreeP( &p->pAbcWlcCnf );
    Vec_StrFreeP( &p->pAbcWlcStr );
    ABC_FREE( p );
    s_GlobalFrame = NULL;
}